

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O2

SharedPtr<Filter> __thiscall
Rml::FilterDropShadowInstancer::InstanceFilter
          (FilterDropShadowInstancer *this,String *param_1,PropertyDictionary *properties)

{
  bool bVar1;
  int iVar2;
  Colour<unsigned_char,_255,_false> in_color;
  Property *this_00;
  Property *this_01;
  Property *this_02;
  Property *this_03;
  NumericValue in_offset_x;
  NumericValue in_offset_y;
  NumericValue in_sigma;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 auVar4 [16];
  SharedPtr<Filter> SVar5;
  SharedPtr<Rml::FilterDropShadow> decorator;
  FilterDropShadow *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  this_00 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[8]);
  this_01 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[9]);
  this_02 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[10]);
  this_03 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[0xb]);
  auVar4._0_4_ = -(uint)((int)((ulong)this_00 >> 0x20) == 0 && (int)this_00 == 0);
  auVar4._4_4_ = -(uint)((int)this_01 == 0 && (int)((ulong)this_01 >> 0x20) == 0);
  auVar4._8_4_ = -(uint)((int)((ulong)this_02 >> 0x20) == 0 && (int)this_02 == 0);
  auVar4._12_4_ = -(uint)((int)this_03 == 0 && (int)((ulong)this_03 >> 0x20) == 0);
  iVar2 = movmskps((int)this_03,auVar4);
  if (iVar2 == 0) {
    ::std::make_shared<Rml::FilterDropShadow>();
    in_color = Property::Get<Rml::Colour<unsigned_char,255,false>>(this_00);
    in_offset_x = Property::GetNumericValue(this_01);
    in_offset_y = Property::GetNumericValue(this_02);
    in_sigma = Property::GetNumericValue(this_03);
    bVar1 = FilterDropShadow::Initialise(local_48,in_color,in_offset_x,in_offset_y,in_sigma);
    _Var3._M_pi = a_Stack_40[0]._M_pi;
    if (bVar1) {
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)local_48;
      (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var3._M_pi;
    }
    else {
      (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)0x0;
      (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)0x0;
    (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var3._M_pi = extraout_RDX;
  }
  SVar5.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  SVar5.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedPtr<Filter>)SVar5.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Filter> FilterDropShadowInstancer::InstanceFilter(const String& /*name*/, const PropertyDictionary& properties)
{
	const Property* p_color = properties.GetProperty(ids.color);
	const Property* p_offset_x = properties.GetProperty(ids.offset_x);
	const Property* p_offset_y = properties.GetProperty(ids.offset_y);
	const Property* p_sigma = properties.GetProperty(ids.sigma);
	if (!p_color || !p_offset_x || !p_offset_y || !p_sigma)
		return nullptr;

	auto decorator = MakeShared<FilterDropShadow>();
	if (decorator->Initialise(p_color->Get<Colourb>(), p_offset_x->GetNumericValue(), p_offset_y->GetNumericValue(), p_sigma->GetNumericValue()))
		return decorator;

	return nullptr;
}